

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_setup_decoder(opj_j2k_t *j2k,opj_dparameters_t *parameters)

{
  void *pvVar1;
  undefined4 *in_RSI;
  long in_RDI;
  opj_cp_t *cp;
  
  if ((in_RDI != 0) && (in_RSI != (undefined4 *)0x0)) {
    pvVar1 = calloc(1,0x90);
    *(undefined4 *)((long)pvVar1 + 0x24) = *in_RSI;
    *(undefined4 *)((long)pvVar1 + 0x28) = in_RSI[1];
    *(undefined4 *)((long)pvVar1 + 0x2c) = in_RSI[0x80e];
    *(void **)(in_RDI + 0x60) = pvVar1;
  }
  return;
}

Assistant:

void j2k_setup_decoder(opj_j2k_t *j2k, opj_dparameters_t *parameters) {
	if(j2k && parameters) {
		/* create and initialize the coding parameters structure */
		opj_cp_t *cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));
		cp->reduce = parameters->cp_reduce;	
		cp->layer = parameters->cp_layer;
		cp->limit_decoding = parameters->cp_limit_decoding;

#ifdef USE_JPWL
		cp->correct = parameters->jpwl_correct;
		cp->exp_comps = parameters->jpwl_exp_comps;
		cp->max_tiles = parameters->jpwl_max_tiles;
#endif /* USE_JPWL */


		/* keep a link to cp so that we can destroy it later in j2k_destroy_decompress */
		j2k->cp = cp;
	}
}